

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_type.cc
# Opt level: O2

void ASN1_TYPE_set(ASN1_TYPE *a,int type,void *value)

{
  ASN1_BOOLEAN AVar1;
  
  asn1_type_cleanup((ASN1_TYPE *)a);
  a->type = type;
  if (type == 1) {
    AVar1 = 0xff;
    if (value == (void *)0x0) {
      AVar1 = 0;
    }
    (a->value).boolean = AVar1;
  }
  else if ((type == 6) || (type != 5)) {
    (a->value).ptr = (char *)value;
  }
  else {
    (a->value).ptr = (char *)0x0;
  }
  return;
}

Assistant:

void ASN1_TYPE_set(ASN1_TYPE *a, int type, void *value) {
  asn1_type_cleanup(a);
  a->type = type;
  switch (type) {
    case V_ASN1_NULL:
      a->value.ptr = NULL;
      break;
    case V_ASN1_BOOLEAN:
      a->value.boolean = value ? ASN1_BOOLEAN_TRUE : ASN1_BOOLEAN_FALSE;
      break;
    case V_ASN1_OBJECT:
      a->value.object = reinterpret_cast<ASN1_OBJECT *>(value);
      break;
    default:
      a->value.asn1_string = reinterpret_cast<ASN1_STRING *>(value);
      break;
  }
}